

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

void NscPushAssignment(CNscPStackEntry *pOut,NscPCode nCode,NscType nType,CNscPStackEntry *pLhs,
                      CNscPStackEntry *pRhs)

{
  size_t *psVar1;
  uchar *puVar2;
  
  if ((((pLhs->m_nDataSize == 0) ||
       (psVar1 = (size_t *)pLhs->m_pauchData, *psVar1 != pLhs->m_nDataSize)) ||
      ((int)psVar1[1] != 0)) || ((psVar1[5] & 0xbc) != 0)) {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorAssignLHSNotVariable);
    if (pOut->m_nType != NscType_Unknown) {
LAB_0014a389:
      __assert_fail("m_nType == NscType_Unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0xee,"void CNscPStackEntry::SetType(NscType)");
    }
    pOut->m_nType = NscType_Error;
  }
  else {
    if (((g_pCtx->m_fWarnOnAssignRHSIsAssignment == true) && ((pRhs->m_ulFlags & 0x800000) == 0)) &&
       ((pRhs->m_nDataSize != 0 &&
        ((*(size_t *)pRhs->m_pauchData == pRhs->m_nDataSize &&
         ((int)*(size_t *)((long)pRhs->m_pauchData + 8) - 0x14U < 0xc)))))) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedRHSAssign);
    }
    puVar2 = pLhs->m_pauchData;
    CNscPStackEntry::PushAssignment
              (pOut,nCode,nType,*(NscType *)(puVar2 + 0x10),pRhs->m_nType,*(size_t *)(puVar2 + 0x18)
               ,*(int *)(puVar2 + 0x20),*(int *)(puVar2 + 0x24),*(UINT32 *)(puVar2 + 0x28),
               pRhs->m_pauchData,pRhs->m_nDataSize);
    if (pOut->m_nType != NscType_Unknown) goto LAB_0014a389;
    pOut->m_nType = nType;
  }
  return;
}

Assistant:

void NscPushAssignment (CNscPStackEntry *pOut, NscPCode nCode,
	NscType nType, CNscPStackEntry *pLhs, CNscPStackEntry *pRhs)
{

	//
	// Validate 
	//

	if (!pLhs ->IsSimpleVariable ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorAssignLHSNotVariable);
		pOut ->SetType (NscType_Error);
		return;
	}

	//
	// If we are detecting the standard compiler's parser limitation with
	// nested assignments
	//

	if (g_pCtx ->GetWarnOnAssignRHSIsAssignment () && pRhs ->IsAssignment ())
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedRHSAssign);

	//
	// Create the pcode
	//

	NscPCodeVariable *pv = (NscPCodeVariable *) pLhs ->GetData ();
	pOut ->PushAssignment (nCode, nType, pv ->nSourceType, pRhs ->GetType (),
		pv ->nSymbol, pv ->nElement, pv ->nStackOffset, pv ->ulFlags, 
		pRhs ->GetData (), pRhs ->GetDataSize ());
	pOut ->SetType (nType);
	return;
}